

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageGetStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **ppStmt,char **pzErrMsg)

{
  int *piVar1;
  sqlite3_stmt *pStmt;
  Fts5Config *pFVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  sqlite3_stmt **ppStmt_00;
  ulong uVar9;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  uVar9 = (ulong)(uint)eStmt;
  ppStmt_00 = p->aStmt + uVar9;
  if (*ppStmt_00 != (sqlite3_stmt *)0x0) goto LAB_001deebe;
  pFVar2 = p->pConfig;
  switch(uVar9) {
  case 0:
  case 1:
    pcVar4 = pFVar2->zContentRowid;
    pcVar4 = sqlite3_mprintf((&PTR_anon_var_dwarf_8b036_0023f190)[uVar9],pFVar2->zContentExprlist,
                             pFVar2->zContent,pcVar4,pcVar4,pcVar4);
    break;
  case 2:
  case 3:
    pcVar5 = (&PTR_anon_var_dwarf_8b036_0023f190)[uVar9];
    pcVar4 = pFVar2->zContentExprlist;
    pcVar7 = pFVar2->zContent;
    pcVar6 = pFVar2->zContentRowid;
    goto LAB_001defcb;
  case 4:
  case 5:
    lVar8 = 0;
    pcVar5 = (char *)0x0;
    do {
      if (pFVar2->nCol < lVar8) break;
      if (((lVar8 == 0) || (pFVar2->eContent == 0)) || (pFVar2->abUnindexed[lVar8 + -1] != '\0')) {
        pcVar4 = ",";
        if (pcVar5 == (char *)0x0) {
          pcVar4 = "";
        }
        pcVar5 = sqlite3Fts5Mprintf(&local_3c,"%z%s?%d",pcVar5,pcVar4,(ulong)((int)lVar8 + 1));
      }
      lVar8 = lVar8 + 1;
    } while (local_3c == 0);
    if (((pFVar2->bLocale != 0) && (pFVar2->eContent == 0)) && (local_3c == 0)) {
      lVar8 = 0;
      do {
        if (pFVar2->nCol <= lVar8) break;
        if (pFVar2->abUnindexed[lVar8] == '\0') {
          pcVar5 = sqlite3Fts5Mprintf(&local_3c,"%z,?%d",pcVar5,
                                      (ulong)((int)lVar8 + pFVar2->nCol + 2));
        }
        lVar8 = lVar8 + 1;
      } while (local_3c == 0);
    }
    pcVar4 = sqlite3Fts5Mprintf(&local_3c,(&PTR_anon_var_dwarf_8b036_0023f190)[uVar9],pFVar2->zDb,
                                pFVar2->zName);
    sqlite3_free(pcVar5);
    break;
  default:
    pcVar4 = (&PTR_anon_var_dwarf_8b036_0023f190)[uVar9];
    pcVar5 = pFVar2->zDb;
    pcVar7 = pFVar2->zName;
    goto LAB_001deffc;
  case 7:
    pcVar5 = (&PTR_anon_var_dwarf_8b036_0023f190)[uVar9];
    pcVar4 = pFVar2->zDb;
    pcVar7 = pFVar2->zName;
    pcVar6 = ",?";
    if (pFVar2->bContentlessDelete == 0) {
      pcVar6 = "";
    }
    goto LAB_001defcb;
  case 9:
    pcVar5 = (&PTR_anon_var_dwarf_8b036_0023f190)[uVar9];
    pcVar4 = ",origin";
    if (pFVar2->bContentlessDelete == 0) {
      pcVar4 = "";
    }
    pcVar7 = pFVar2->zDb;
    pcVar6 = pFVar2->zName;
LAB_001defcb:
    pcVar4 = sqlite3_mprintf(pcVar5,pcVar4,pcVar7,pcVar6);
    break;
  case 0xb:
    pcVar4 = (&PTR_anon_var_dwarf_8b036_0023f190)[uVar9];
    pcVar7 = pFVar2->zContent;
    pcVar5 = pFVar2->zContentExprlist;
LAB_001deffc:
    pcVar4 = sqlite3_mprintf(pcVar4,pcVar5,pcVar7);
  }
  if (pcVar4 == (char *)0x0) {
    local_3c = 7;
  }
  else {
    piVar1 = &p->pConfig->bLock;
    *piVar1 = *piVar1 + 1;
    iVar3 = sqlite3LockAndPrepare
                      (pFVar2->db,pcVar4,-1,(uint)(3 < eStmt) * 4 + 0x81,(Vdbe *)0x0,ppStmt_00,
                       (char **)0x0);
    piVar1 = &p->pConfig->bLock;
    *piVar1 = *piVar1 + -1;
    local_3c = iVar3;
    sqlite3_free(pcVar4);
    if ((pzErrMsg != (char **)0x0) && (iVar3 != 0)) {
      pcVar4 = sqlite3_errmsg(pFVar2->db);
      pcVar4 = sqlite3_mprintf("%s",pcVar4);
      *pzErrMsg = pcVar4;
    }
    if ((eStmt - 4U < 7) && (iVar3 == 1)) {
      local_3c = 0xb;
    }
  }
LAB_001deebe:
  pStmt = *ppStmt_00;
  *ppStmt = pStmt;
  sqlite3_reset(pStmt);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

static int fts5StorageGetStmt(
  Fts5Storage *p,                 /* Storage handle */
  int eStmt,                      /* FTS5_STMT_XXX constant */
  sqlite3_stmt **ppStmt,          /* OUT: Prepared statement handle */
  char **pzErrMsg                 /* OUT: Error message (if any) */
){
  int rc = SQLITE_OK;

  /* If there is no %_docsize table, there should be no requests for
  ** statements to operate on it.  */
  assert( p->pConfig->bColumnsize || (
        eStmt!=FTS5_STMT_REPLACE_DOCSIZE
     && eStmt!=FTS5_STMT_DELETE_DOCSIZE
     && eStmt!=FTS5_STMT_LOOKUP_DOCSIZE
  ));

  assert( eStmt>=0 && eStmt<ArraySize(p->aStmt) );
  if( p->aStmt[eStmt]==0 ){
    const char *azStmt[] = {
      "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC",
      "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC",
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP  */
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP2  */

      "INSERT INTO %Q.'%q_content' VALUES(%s)",         /* INSERT_CONTENT  */
      "REPLACE INTO %Q.'%q_content' VALUES(%s)",        /* REPLACE_CONTENT */
      "DELETE FROM %Q.'%q_content' WHERE id=?",         /* DELETE_CONTENT  */
      "REPLACE INTO %Q.'%q_docsize' VALUES(?,?%s)",     /* REPLACE_DOCSIZE  */
      "DELETE FROM %Q.'%q_docsize' WHERE id=?",         /* DELETE_DOCSIZE  */

      "SELECT sz%s FROM %Q.'%q_docsize' WHERE id=?",    /* LOOKUP_DOCSIZE  */

      "REPLACE INTO %Q.'%q_config' VALUES(?,?)",        /* REPLACE_CONFIG */
      "SELECT %s FROM %s AS T",                         /* SCAN */
    };
    Fts5Config *pC = p->pConfig;
    char *zSql = 0;

    assert( ArraySize(azStmt)==ArraySize(p->aStmt) );

    switch( eStmt ){
      case FTS5_STMT_SCAN:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent
        );
        break;

      case FTS5_STMT_SCAN_ASC:
      case FTS5_STMT_SCAN_DESC:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zContentExprlist,
            pC->zContent, pC->zContentRowid, pC->zContentRowid,
            pC->zContentRowid
        );
        break;

      case FTS5_STMT_LOOKUP:
      case FTS5_STMT_LOOKUP2:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent, pC->zContentRowid
        );
        break;

      case FTS5_STMT_INSERT_CONTENT:
      case FTS5_STMT_REPLACE_CONTENT: {
        char *zBind = 0;
        int i;

        assert( pC->eContent==FTS5_CONTENT_NORMAL
             || pC->eContent==FTS5_CONTENT_UNINDEXED
        );

        /* Add bindings for the "c*" columns - those that store the actual
        ** table content. If eContent==NORMAL, then there is one binding
        ** for each column. Or, if eContent==UNINDEXED, then there are only
        ** bindings for the UNINDEXED columns. */
        for(i=0; rc==SQLITE_OK && i<(pC->nCol+1); i++){
          if( !i || pC->eContent==FTS5_CONTENT_NORMAL || pC->abUnindexed[i-1] ){
            zBind = sqlite3Fts5Mprintf(&rc, "%z%s?%d", zBind, zBind?",":"",i+1);
          }
        }

        /* Add bindings for any "l*" columns. Only non-UNINDEXED columns
        ** require these.  */
        if( pC->bLocale && pC->eContent==FTS5_CONTENT_NORMAL ){
          for(i=0; rc==SQLITE_OK && i<pC->nCol; i++){
            if( pC->abUnindexed[i]==0 ){
              zBind = sqlite3Fts5Mprintf(&rc, "%z,?%d", zBind, pC->nCol+i+2);
            }
          }
        }

        zSql = sqlite3Fts5Mprintf(&rc, azStmt[eStmt], pC->zDb, pC->zName,zBind);
        sqlite3_free(zBind);
        break;
      }

      case FTS5_STMT_REPLACE_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName,
          (pC->bContentlessDelete ? ",?" : "")
        );
        break;

      case FTS5_STMT_LOOKUP_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            (pC->bContentlessDelete ? ",origin" : ""),
            pC->zDb, pC->zName
        );
        break;

      default:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName);
        break;
    }

    if( zSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int f = SQLITE_PREPARE_PERSISTENT;
      if( eStmt>FTS5_STMT_LOOKUP2 ) f |= SQLITE_PREPARE_NO_VTAB;
      p->pConfig->bLock++;
      rc = sqlite3_prepare_v3(pC->db, zSql, -1, f, &p->aStmt[eStmt], 0);
      p->pConfig->bLock--;
      sqlite3_free(zSql);
      if( rc!=SQLITE_OK && pzErrMsg ){
        *pzErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pC->db));
      }
      if( rc==SQLITE_ERROR && eStmt>FTS5_STMT_LOOKUP2 && eStmt<FTS5_STMT_SCAN ){
        /* One of the internal tables - not the %_content table - is missing.
        ** This counts as a corrupted table.  */
       rc = SQLITE_CORRUPT;
      }
    }
  }

  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return rc;
}